

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> *
obx::internal::idVectorOrThrow
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          OBX_id_array *cIds)

{
  pointer __dest;
  obx_err err;
  size_t __n;
  
  if (cIds == (OBX_id_array *)0x0) {
    err = obx_last_error_code();
    throwLastError(err,(char *)0x0);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (cIds->count != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (__return_storage_ptr__,cIds->count);
    __dest = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __n = (long)(__return_storage_ptr__->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)__dest;
    if ((long)__n >> 3 != cIds->count) {
      throwIllegalStateException("State condition failed: ","result.size() == cIds->count");
    }
    memcpy(__dest,cIds->ids,__n);
  }
  obx_id_array_free(cIds);
  return __return_storage_ptr__;
}

Assistant:

std::vector<obx_id> idVectorOrThrow(OBX_id_array* cIds) {
    if (cIds == nullptr) internal::throwLastError();

    try {
        std::vector<obx_id> result;
        if (cIds->count > 0) {
            result.resize(cIds->count);
            OBX_VERIFY_STATE(result.size() == cIds->count);
            memcpy(result.data(), cIds->ids, result.size() * sizeof(result[0]));
        }
        obx_id_array_free(cIds);
        return result;
    } catch (...) {
        obx_id_array_free(cIds);
        throw;
    }
}